

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

_Bool pageant_add_ssh2_key(ssh2_userkey *skey)

{
  PageantKey *pk_00;
  strbuf *psVar1;
  PageantKey *pPVar2;
  char *pcVar3;
  ptrlen pVar4;
  PageantKey *pk_in_tree;
  size_t local_28;
  PageantKey *pk;
  ssh2_userkey *skey_local;
  
  pk_00 = (PageantKey *)safemalloc(1,0x58,0);
  memset(pk_00,0,0x58);
  (pk_00->sort).ssh_version = 2;
  psVar1 = makeblob2(skey);
  pk_00->public_blob = psVar1;
  pVar4 = ptrlen_from_strbuf(pk_00->public_blob);
  pk_in_tree = (PageantKey *)pVar4.ptr;
  (pk_00->sort).public_blob.ptr = pk_in_tree;
  local_28 = pVar4.len;
  (pk_00->sort).public_blob.len = local_28;
  (pk_00->blocked_requests).prev = &pk_00->blocked_requests;
  (pk_00->blocked_requests).next = &pk_00->blocked_requests;
  pPVar2 = (PageantKey *)add234(keytree,pk_00);
  if (pPVar2 == pk_00) {
    (pk_00->field_3).skey = skey;
    if (skey->comment != (char *)0x0) {
      pcVar3 = dupstr(skey->comment);
      pk_00->comment = pcVar3;
    }
    skey_local._7_1_ = true;
  }
  else if ((pPVar2->field_3).rkey == (RSAKey *)0x0) {
    (pPVar2->field_3).skey = skey;
    pk_free(pk_00);
    skey_local._7_1_ = true;
  }
  else {
    pk_free(pk_00);
    skey_local._7_1_ = false;
  }
  return skey_local._7_1_;
}

Assistant:

static bool pageant_add_ssh2_key(ssh2_userkey *skey)
{
    PageantKey *pk = snew(PageantKey);
    memset(pk, 0, sizeof(PageantKey));
    pk->sort.ssh_version = 2;
    pk->public_blob = makeblob2(skey);
    pk->sort.public_blob = ptrlen_from_strbuf(pk->public_blob);
    pk->blocked_requests.next = pk->blocked_requests.prev =
        &pk->blocked_requests;

    PageantKey *pk_in_tree = add234(keytree, pk);
    if (pk_in_tree == pk) {
        /* The key wasn't in the tree at all, and we've just added it. */
        pk->skey = skey;
        if (skey->comment)
            pk->comment = dupstr(skey->comment);
        return true;
    } else if (!pk_in_tree->skey) {
        /* The key was only stored encrypted, and now we have an
         * unencrypted version to add to the existing record. */
        pk_in_tree->skey = skey;
        pk_free(pk);
        return true;
    } else {
        /* The key was already in the tree in full. */
        pk_free(pk);
        return false;
    }
}